

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpSolver.cc
# Opt level: O2

void __thiscall Glucose::SimpSolver::SimpSolver(SimpSolver *this,SimpSolver *s)

{
  ClauseAllocator *this_00;
  int iVar1;
  CRef CVar2;
  vec<Glucose::Lit> dummy;
  
  Solver::Solver(&this->super_Solver,&s->super_Solver);
  (this->super_Solver).super_Clone._vptr_Clone = (_func_int **)&PTR_clone_00123d10;
  iVar1 = s->clause_lim;
  this->grow = s->grow;
  this->clause_lim = iVar1;
  this->subsumption_lim = s->subsumption_lim;
  this->simp_garbage_frac = s->simp_garbage_frac;
  this->use_asymm = s->use_asymm;
  this->use_rcheck = s->use_rcheck;
  this->use_elim = s->use_elim;
  iVar1 = s->asymm_lits;
  this->merges = s->merges;
  this->asymm_lits = iVar1;
  this->eliminated_vars = s->eliminated_vars;
  this->use_simplification = s->use_simplification;
  this->elimorder = s->elimorder;
  this_00 = &(this->super_Solver).ca;
  (this->elimclauses).data = (uint *)0x0;
  (this->elimclauses).sz = 0;
  (this->elimclauses).cap = 0;
  (this->touched).data = (char *)0x0;
  (this->touched).sz = 0;
  (this->touched).cap = 0;
  (this->occurs).occs.data = (vec<unsigned_int> *)0x0;
  (this->occurs).occs.sz = 0;
  (this->occurs).occs.cap = 0;
  (this->occurs).dirty.data = (char *)0x0;
  (this->occurs).dirty.sz = 0;
  (this->occurs).dirty.cap = 0;
  (this->occurs).dirties.data = (int *)0x0;
  (this->occurs).dirties.sz = 0;
  (this->occurs).dirties.cap = 0;
  (this->occurs).deleted.ca = this_00;
  (this->n_occ).data = (int *)0x0;
  (this->n_occ).sz = 0;
  (this->n_occ).cap = 0;
  (this->elim_heap).lt.n_occ = &this->n_occ;
  (this->elim_heap).heap.data = (int *)0x0;
  (this->elim_heap).heap.sz = 0;
  (this->elim_heap).heap.cap = 0;
  (this->elim_heap).indices.data = (int *)0x0;
  (this->elim_heap).indices.sz = 0;
  (this->elim_heap).indices.cap = 0;
  Queue<unsigned_int>::Queue(&this->subsumption_queue);
  (this->eliminated).data = (char *)0x0;
  (this->eliminated).sz = 0;
  (this->eliminated).cap = 0;
  (this->frozen).data = (char *)0x0;
  (this->frozen).sz = 0;
  (this->frozen).cap = 0;
  iVar1 = s->n_touched;
  this->bwdsub_assigns = s->bwdsub_assigns;
  this->n_touched = iVar1;
  vec<Glucose::Lit>::vec(&dummy,1,(Lit *)&lit_Undef);
  (this->super_Solver).ca.super_RegionAllocator<unsigned_int>.field_0x14 = 1;
  CVar2 = ClauseAllocator::alloc<Glucose::vec<Glucose::Lit>>(this_00,&dummy,false,false);
  this->bwdsub_tmpunit = CVar2;
  (this->super_Solver).remove_satisfied = false;
  vec<unsigned_int>::memCopyTo(&s->elimclauses,&this->elimclauses);
  vec<char>::memCopyTo(&s->touched,&this->touched);
  OccLists<int,_Glucose::vec<unsigned_int>,_Glucose::SimpSolver::ClauseDeleted>::copyTo
            (&s->occurs,&this->occurs);
  vec<int>::memCopyTo(&s->n_occ,&this->n_occ);
  Heap<Glucose::SimpSolver::ElimLt>::copyTo(&s->elim_heap,&this->elim_heap);
  Queue<unsigned_int>::copyTo(&s->subsumption_queue,&this->subsumption_queue);
  vec<char>::memCopyTo(&s->frozen,&this->frozen);
  vec<char>::memCopyTo(&s->eliminated,&this->eliminated);
  this->use_simplification = s->use_simplification;
  iVar1 = s->n_touched;
  this->bwdsub_assigns = s->bwdsub_assigns;
  this->n_touched = iVar1;
  this->bwdsub_tmpunit = s->bwdsub_tmpunit;
  (this->super_Solver).qhead = (s->super_Solver).qhead;
  (this->super_Solver).ok = (s->super_Solver).ok;
  vec<Glucose::Lit>::~vec(&dummy);
  return;
}

Assistant:

SimpSolver::SimpSolver(const SimpSolver &s) : Solver(s)
  , grow               (s.grow)
  , clause_lim         (s.clause_lim)
  , subsumption_lim    (s.subsumption_lim)
  , simp_garbage_frac  (s.simp_garbage_frac)
  , use_asymm          (s.use_asymm)
  , use_rcheck         (s.use_rcheck)
  , use_elim           (s.use_elim)
  , merges             (s.merges)
  , asymm_lits         (s.asymm_lits)
  , eliminated_vars    (s.eliminated_vars)
  , use_simplification (s.use_simplification)
  , elimorder          (s.elimorder)
  , occurs             (ClauseDeleted(ca))
  , elim_heap          (ElimLt(n_occ))
  , bwdsub_assigns     (s.bwdsub_assigns)
  , n_touched          (s.n_touched)
{
    // TODO: Copy dummy... what is it???
    vec<Lit> dummy(1,lit_Undef);
    ca.extra_clause_field = true; // NOTE: must happen before allocating the dummy clause below.
    bwdsub_tmpunit        = ca.alloc(dummy);
    remove_satisfied      = false;
    //End TODO  
    

    s.elimclauses.memCopyTo(elimclauses);
    s.touched.memCopyTo(touched);
    s.occurs.copyTo(occurs);
    s.n_occ.memCopyTo(n_occ);
    s.elim_heap.copyTo(elim_heap);
    s.subsumption_queue.copyTo(subsumption_queue);
    s.frozen.memCopyTo(frozen);
    s.eliminated.memCopyTo(eliminated);

    use_simplification = s.use_simplification;
    bwdsub_assigns = s.bwdsub_assigns;
    n_touched = s.n_touched;
    bwdsub_tmpunit = s.bwdsub_tmpunit;
    qhead = s.qhead;
    ok = s.ok;
}